

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::~QArrayDataPointer
          (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *this)

{
  Data *pDVar1;
  long lVar2;
  ButtonInfo *pBVar3;
  long lVar4;
  
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      lVar2 = this->size;
      if (lVar2 != 0) {
        pBVar3 = this->ptr;
        lVar4 = 0;
        do {
          QPainterPath::~QPainterPath(&(pBVar3->rule).clipPath + lVar4);
          QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
                    ((QSharedDataPointer<QStyleSheetImageData> *)
                     ((long)&(pBVar3->rule).iconPtr.d.ptr + lVar4));
          QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
                    ((QSharedDataPointer<QStyleSheetImageData> *)
                     ((long)&(pBVar3->rule).img.d.ptr + lVar4));
          QSharedDataPointer<QStyleSheetPositionData>::~QSharedDataPointer
                    ((QSharedDataPointer<QStyleSheetPositionData> *)
                     ((long)&(pBVar3->rule).p.d.ptr + lVar4));
          QSharedDataPointer<QStyleSheetGeometryData>::~QSharedDataPointer
                    ((QSharedDataPointer<QStyleSheetGeometryData> *)
                     ((long)&(pBVar3->rule).geo.d.ptr + lVar4));
          QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer
                    ((QSharedDataPointer<QStyleSheetOutlineData> *)
                     ((long)&(pBVar3->rule).ou.d.ptr + lVar4));
          QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer
                    ((QSharedDataPointer<QStyleSheetBorderData> *)
                     ((long)&(pBVar3->rule).bd.d.ptr + lVar4));
          QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer
                    ((QSharedDataPointer<QStyleSheetBackgroundData> *)
                     ((long)&(pBVar3->rule).bg.d.ptr + lVar4));
          QSharedDataPointer<QStyleSheetBoxData>::~QSharedDataPointer
                    ((QSharedDataPointer<QStyleSheetBoxData> *)
                     ((long)&(pBVar3->rule).b.d.ptr + lVar4));
          QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer
                    ((QSharedDataPointer<QStyleSheetPaletteData> *)
                     ((long)&(pBVar3->rule).pal.d.ptr + lVar4));
          QHash<QString,_QVariant>::~QHash
                    ((QHash<QString,_QVariant> *)((long)&(pBVar3->rule).styleHints.d + lVar4));
          QFont::~QFont(&(pBVar3->rule).font + lVar4);
          QBrush::~QBrush(&(pBVar3->rule).defaultBackground + lVar4);
          lVar4 = lVar4 + 0x98;
        } while (lVar2 * 0x98 - lVar4 != 0);
      }
      QArrayData::deallocate(&this->d->super_QArrayData,0x98,0x10);
      return;
    }
  }
  return;
}

Assistant:

bool deref() noexcept { return !d || d->deref(); }